

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  bool bVar1;
  bool bVar2;
  LogMessage *pLVar3;
  long lVar4;
  int i_3;
  int i;
  long lVar5;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  pair<const_void_*,_int> value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string path;
  
  value_local.first = value.first;
  value_local.second = value.second;
  bVar1 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    (&this->by_name_,(file->name_).ptr_,&value_local);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&path,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x78);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)&path,"File already exists in database: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
    internal::LogMessage::~LogMessage((LogMessage *)&path);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    path._M_dataplus._M_p = (pointer)&path.field_2;
    path._M_string_length = 0;
    path.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&path,(string *)(file->package_).ptr_);
    if (path._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&path);
    }
  }
  lVar5 = 0;
  do {
    if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
      lVar5 = 0;
      goto LAB_002ca83a;
    }
    std::operator+(&local_88,&path,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)((file->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar5]
                    + 0xd8));
    value_00.second = value_local.second;
    value_00.first = value_local.first;
    value_00._12_4_ = 0;
    bVar1 = AddSymbol(this,&local_88,value_00);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar1) break;
    value_04.second = value_local.second;
    value_04.first = value_local.first;
    value_04._12_4_ = 0;
    bVar1 = AddNestedExtensions(this,(file->name_).ptr_,
                                (DescriptorProto *)
                                ((file->message_type_).super_RepeatedPtrFieldBase.rep_)->elements
                                [lVar5],value_04);
    lVar5 = lVar5 + 1;
  } while (bVar1);
  goto LAB_002ca90a;
  while( true ) {
    std::operator+(&local_88,&path,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)((file->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar5] +
                    0x60));
    value_01.second = value_local.second;
    value_01.first = value_local.first;
    value_01._12_4_ = 0;
    bVar1 = AddSymbol(this,&local_88,value_01);
    std::__cxx11::string::~string((string *)&local_88);
    lVar5 = lVar5 + 1;
    if (!bVar1) break;
LAB_002ca83a:
    if ((file->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
      lVar5 = 0;
      goto LAB_002ca892;
    }
  }
  goto LAB_002ca90a;
  while( true ) {
    std::operator+(&local_88,&path,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)((file->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar5] +
                    0x30));
    value_03.second = value_local.second;
    value_03.first = value_local.first;
    value_03._12_4_ = 0;
    bVar2 = AddSymbol(this,&local_88,value_03);
    std::__cxx11::string::~string((string *)&local_88);
    lVar5 = lVar5 + 1;
    if (!bVar2) break;
LAB_002ca92f:
    lVar4 = (long)(file->service_).super_RepeatedPtrFieldBase.current_size_;
    bVar1 = lVar4 <= lVar5;
    if (lVar4 <= lVar5) break;
  }
  goto LAB_002ca90c;
  while( true ) {
    value_05.second = value_local.second;
    value_05.first = value_local.first;
    value_05._12_4_ = 0;
    bVar1 = AddExtension(this,(file->name_).ptr_,
                         (FieldDescriptorProto *)
                         ((file->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar5],
                         value_05);
    lVar5 = lVar5 + 1;
    if (!bVar1) break;
LAB_002ca892:
    if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
      lVar5 = 0;
      goto LAB_002ca92f;
    }
    std::operator+(&local_88,&path,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    ((long)((file->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar5] +
                    0x18));
    value_02.second = value_local.second;
    value_02.first = value_local.first;
    value_02._12_4_ = 0;
    bVar1 = AddSymbol(this,&local_88,value_02);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar1) break;
  }
LAB_002ca90a:
  bVar1 = false;
LAB_002ca90c:
  std::__cxx11::string::~string((string *)&path);
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}